

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::simpleExpression(Parse *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Type TVar2;
  Type TVar3;
  pointer pvVar4;
  long lVar5;
  SymbolTable *pSVar6;
  pointer piVar7;
  uint __val;
  uint uVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  ostream *poVar12;
  uint uVar13;
  size_type *psVar14;
  ulong uVar15;
  Parse *this_00;
  char *this_01;
  uint uVar16;
  long lVar17;
  uint __len;
  Type helper_Type;
  string helper;
  Type local_c4;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  SymbolTableElement local_80;
  
  iVar10 = this->curIndex;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  iVar9 = additiveExpression(this);
  if (iVar9 == 0) {
    this->curIndex = iVar10;
    iVar10 = 0;
  }
  else {
    this_00 = (Parse *)&this->relopTmp;
    std::__cxx11::string::_M_assign((string *)&local_a0);
    TVar2 = this->relopType;
    local_c4 = TVar2;
    iVar10 = relop(this);
    if (iVar10 != 0) {
      iVar10 = additiveExpression(this);
      if (iVar10 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,anon_var_dwarf_33e3c + 9,0xf);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_0010de96:
        exit(0);
      }
      TVar3 = this->relopType;
      if (((TVar3 < ARRAY) && ((0x16U >> (TVar3 & 0x1f) & 1) != 0)) && (TVar2 == CHAR)) {
        toSymTypeName_abi_cxx11_(&local_80.name,this_00,&local_c4);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_80.name._M_dataplus._M_p,
                             local_80.name._M_string_length);
        this_01 = anon_var_dwarf_33e08;
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,anon_var_dwarf_33e08,0xf);
        toSymTypeName_abi_cxx11_(&local_c0,(Parse *)this_01,&this->relopType);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar12,local_c0._M_dataplus._M_p,local_c0._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar12);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_80);
        goto LAB_0010de96;
      }
      uVar16 = this->t_num + 1;
      this->t_num = uVar16;
      __val = -uVar16;
      if (0 < (int)uVar16) {
        __val = uVar16;
      }
      __len = 1;
      if (9 < __val) {
        uVar15 = (ulong)__val;
        uVar8 = 4;
        do {
          __len = uVar8;
          uVar13 = (uint)uVar15;
          if (uVar13 < 100) {
            __len = __len - 2;
            goto LAB_0010dc36;
          }
          if (uVar13 < 1000) {
            __len = __len - 1;
            goto LAB_0010dc36;
          }
          if (uVar13 < 10000) goto LAB_0010dc36;
          uVar15 = uVar15 / 10000;
          uVar8 = __len + 4;
        } while (99999 < uVar13);
        __len = __len + 1;
      }
LAB_0010dc36:
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_c0,(char)__len - (char)((int)uVar16 >> 0x1f))
      ;
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_c0._M_dataplus._M_p + (uVar16 >> 0x1f),__len,__val);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x12b557);
      paVar1 = &local_80.name.field_2;
      psVar14 = (size_type *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar14) {
        local_80.name.field_2._M_allocated_capacity = *psVar14;
        local_80.name.field_2._8_8_ = plVar11[3];
        local_80.name._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_80.name.field_2._M_allocated_capacity = *psVar14;
        local_80.name._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_80.name._M_string_length = plVar11[1];
      *plVar11 = (long)psVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::operator=((string *)&this->curTmpName,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.name._M_dataplus._M_p,
                        local_80.name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      std::vector<QuadTuple,std::allocator<QuadTuple>>::
      emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
                ((vector<QuadTuple,std::allocator<QuadTuple>> *)this->quadVec,&this->relopName,
                 &local_a0,&this->relopTmp,&this->curTmpName);
      local_80.pfinalind = 0;
      local_80._60_4_ = 0;
      local_80.constNum = 0.0;
      local_80.type = 0;
      local_80.cat = 0;
      local_80.ctInd = 0;
      local_80.len = 0;
      local_80.name.field_2._M_allocated_capacity = 0;
      local_80.name.field_2._8_8_ = 0;
      local_80.name._M_string_length = 0;
      local_80.aiInd = 0;
      local_80.vall = 0;
      local_80.isTemp = false;
      local_80.isActive = true;
      local_80._74_6_ = 0;
      local_80.name._M_dataplus._M_p = (pointer)paVar1;
      std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>::
      emplace_back<SymbolTableElement>
                ((this->st->symbolTable).
                 super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + this->curFun,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.name._M_dataplus._M_p != paVar1) {
        operator_delete(local_80.name._M_dataplus._M_p,
                        local_80.name.field_2._M_allocated_capacity + 1);
      }
      pvVar4 = (this->st->symbolTable).
               super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar5 = *(long *)&pvVar4[this->curFun].
                        super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                        _M_impl.super__Vector_impl_data;
      lVar17 = (((long)*(pointer *)
                        ((long)&pvVar4[this->curFun].
                                super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>
                                ._M_impl.super__Vector_impl_data + 8) - lVar5 >> 4) *
                -0x3333333333333333 + -1) * 0x50;
      std::__cxx11::string::_M_assign((string *)(lVar5 + lVar17));
      pSVar6 = this->st;
      iVar10 = this->curFun;
      lVar5 = *(long *)&(pSVar6->symbolTable).
                        super__Vector_base<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>,_std::allocator<std::vector<SymbolTableElement,_std::allocator<SymbolTableElement>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar10].
                        super__Vector_base<SymbolTableElement,_std::allocator<SymbolTableElement>_>.
                        _M_impl.super__Vector_impl_data;
      *(undefined8 *)(lVar5 + 0x20 + lVar17) = 0x200000004;
      *(undefined2 *)(lVar5 + 0x48 + lVar17) = 1;
      piVar7 = (pSVar6->vallVec).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar7[iVar10];
      *(int *)(lVar5 + 0x34 + lVar17) = iVar9;
      piVar7[iVar10] = iVar9 + 1;
      std::__cxx11::string::_M_assign((string *)&this->expName);
    }
    std::__cxx11::string::_M_assign((string *)&this->simExpName);
    this->simExpType = this->relopType;
    iVar10 = 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return iVar10;
}

Assistant:

int Parse::simpleExpression() {
    int index = curIndex;
    string helper;
    Type helper_Type;
    if(additiveExpression()) {
        helper = relopTmp;
        helper_Type = relopType;
        if(relop()) {
            if (additiveExpression()) {
                if(!typePriority(relopType, helper_Type)) {
//                    cout << helper_Type << " " << relopType << endl;
                    cout << toSymTypeName(helper_Type) <<"类型不匹配" << toSymTypeName(relopType)<< endl;
                    exit(0);
                }
                curTmpName = "t" + to_string(++t_num);
                quadVec.emplace_back(relopName, helper, relopTmp, curTmpName);
                st.symbolTable[curFun].push_back(SymbolTableElement());
                auto symInd = st.symbolTable[curFun].size() - 1;
                st.symbolTable[curFun][symInd].name = curTmpName;
                st.symbolTable[curFun][symInd].type = Type::BOOL;
                st.symbolTable[curFun][symInd].cat = Category ::CONST;
                st.symbolTable[curFun][symInd].isTemp = true;
                st.symbolTable[curFun][symInd].isActive = false;
                st.symbolTable[curFun][symInd].vall = st.vallVec[curFun];
                st.vallVec[curFun] += 1;
                expName = curTmpName;
            } else {
                cout << "表达式错误" << endl;
                exit(0);
            }
        }
        simExpName = relopTmp;
        simExpType = relopType;
        return 1;
    }
    curIndex = index;
    return 0;
}